

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_mon_spell_message_type(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *name;
  wchar_t msg_index;
  char *type;
  monster_spell *s;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  name = parser_getsym(p,"type");
  iVar1 = message_lookup_by_name(name);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (iVar1 < 0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_MESSAGE;
  }
  else {
    *(int *)((long)pvVar2 + 0xc) = iVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_mon_spell_message_type(struct parser *p)
{
	struct monster_spell *s = parser_priv(p);
	const char *type = parser_getsym(p, "type");
	int msg_index = message_lookup_by_name(type);

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (msg_index < 0) {
		return PARSE_ERROR_INVALID_MESSAGE;
	}
	s->msgt = msg_index;
	return PARSE_ERROR_NONE;
}